

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O0

void __thiscall
luna::SemanticAnalysisVisitor::Visit(SemanticAnalysisVisitor *this,Chunk *chunk,void *data)

{
  pointer pSVar1;
  function<void_()> *in_RDI;
  Guard g_1;
  Guard g;
  Guard *this_00;
  anon_class_8_1_8991fb9c *in_stack_fffffffffffffed8;
  function<void_()> *enter;
  Guard *this_01;
  anon_class_8_1_8991fb9c local_100 [5];
  Guard local_d8 [2];
  Guard local_80;
  function<void_()> local_58 [2];
  
  enter = local_58;
  std::function<void()>::
  function<luna::SemanticAnalysisVisitor::Visit(luna::Chunk*,void*)::__0,void>
            (in_RDI,in_stack_fffffffffffffed8);
  this_01 = &local_80;
  std::function<void()>::
  function<luna::SemanticAnalysisVisitor::Visit(luna::Chunk*,void*)::__1,void>
            (in_RDI,in_stack_fffffffffffffed8);
  Guard::Guard(this_01,enter,in_RDI);
  std::function<void_()>::~function((function<void_()> *)0x1900db);
  std::function<void_()>::~function((function<void_()> *)0x1900e8);
  this_00 = local_d8;
  std::function<void()>::
  function<luna::SemanticAnalysisVisitor::Visit(luna::Chunk*,void*)::__2,void>
            (in_RDI,in_stack_fffffffffffffed8);
  std::function<void()>::
  function<luna::SemanticAnalysisVisitor::Visit(luna::Chunk*,void*)::__3,void>(in_RDI,local_100);
  Guard::Guard(this_01,enter,in_RDI);
  std::function<void_()>::~function((function<void_()> *)0x190147);
  std::function<void_()>::~function((function<void_()> *)0x190151);
  pSVar1 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x190162);
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,in_RDI,0);
  Guard::~Guard(this_00);
  Guard::~Guard(this_00);
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(Chunk *chunk, void *data)
    {
        SEMANTIC_ANALYSIS_GUARD(EnterFunction, LeaveFunction);
        {
            SEMANTIC_ANALYSIS_GUARD(EnterBlock, LeaveBlock);
            chunk->block_->Accept(this, nullptr);
        }
    }